

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void __thiscall
clickhouse::ColumnVector<int>::ColumnVector
          (ColumnVector<int> *this,vector<int,_std::allocator<int>_> *data)

{
  Type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = (Type *)operator_new(0x10);
  Type::Type(this_00,Int32);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<clickhouse::Type*>
            (&local_28,this_00);
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__Column_0016b560;
  (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this_00;
  (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_28._M_pi;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnVector_0016c428;
  std::vector<int,_std::allocator<int>_>::vector(&this->data_,data);
  return;
}

Assistant:

ColumnVector<T>::ColumnVector(const std::vector<T>& data)
    : Column(Type::CreateSimple<T>())
    , data_(data)
{
}